

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O2

ppointer p_hash_table_lookup(PHashTable *table,pconstpointer key)

{
  PHashTableNode *pPVar1;
  ppointer pvVar2;
  
  if (table != (PHashTable *)0x0) {
    pPVar1 = pp_hash_table_find_node
                       (table,key,(puint)((ulong)(long)((int)key + 0x25) % table->size));
    if (pPVar1 == (PHashTableNode *)0x0) {
      pvVar2 = (ppointer)0xffffffffffffffff;
    }
    else {
      pvVar2 = pPVar1->value;
    }
    return pvVar2;
  }
  return (ppointer)0x0;
}

Assistant:

P_LIB_API ppointer
p_hash_table_lookup (const PHashTable *table, pconstpointer key)
{
	PHashTableNode	*node;
	puint		hash;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	hash = pp_hash_table_calc_hash (key, table->size);

	return ((node = pp_hash_table_find_node (table, key, hash)) == NULL) ? (ppointer) (-1) : node->value;
}